

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgSmallDeterminant.cpp
# Opt level: O3

HaF64 Determinant3x3(HaF64 (*matrix) [3],HaF64 *error)

{
  HaF64 HVar1;
  bool bVar2;
  ulong uVar3;
  undefined8 uVar4;
  HaI32 i;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  double dVar10;
  double dVar12;
  undefined1 auVar11 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  HaF64 cofactor [2] [2];
  
  dVar15 = -1.0;
  auVar14 = ZEXT816(0) << 0x40;
  auVar13 = ZEXT816(0) << 0x40;
  lVar5 = 0;
  do {
    lVar8 = 0;
    bVar2 = true;
    do {
      bVar6 = bVar2;
      lVar7 = 0;
      iVar9 = 0;
      do {
        if (lVar5 != lVar7) {
          cofactor[lVar8][iVar9] = matrix[lVar8][lVar7];
          iVar9 = iVar9 + 1;
        }
        lVar7 = lVar7 + 1;
      } while (lVar7 != 3);
      lVar8 = 1;
      bVar2 = false;
    } while (bVar6);
    auVar11 = vpermilpd_avx((undefined1  [16])cofactor[1],1);
    HVar1 = matrix[2][lVar5];
    auVar20._8_8_ = 0;
    auVar20._0_8_ = HVar1;
    lVar5 = lVar5 + 1;
    auVar16._0_8_ = auVar11._0_8_ * (double)cofactor[0][0];
    auVar16._8_8_ = auVar11._8_8_ * (double)cofactor[0][1];
    auVar21._0_8_ = (HaF64)-(double)HVar1;
    auVar21._8_8_ = 0x8000000000000000;
    auVar18._0_8_ = -auVar16._0_8_;
    auVar18._8_8_ = -auVar16._8_8_;
    uVar3 = vcmppd_avx512vl(auVar18,auVar16,2);
    bVar2 = (bool)((byte)(uVar3 & 3) & 1);
    dVar10 = (double)((ulong)bVar2 * (long)auVar16._0_8_ | (ulong)!bVar2 * (long)auVar18._0_8_);
    uVar3 = (uVar3 & 3) >> 1;
    dVar12 = (double)(uVar3 * (long)auVar16._8_8_ | (ulong)!SUB81(uVar3,0) * (long)auVar18._8_8_);
    auVar11 = vhsubpd_avx(auVar16,auVar16);
    auVar19._0_8_ = dVar10 + dVar12;
    auVar19._8_8_ = dVar10 + dVar12;
    uVar4 = vcmpsd_avx512f(auVar21,auVar20,6);
    bVar2 = (bool)((byte)uVar4 & 1);
    dVar10 = dVar15 * auVar11._0_8_;
    dVar15 = -dVar15;
    auVar17._8_8_ = 0;
    auVar17._0_8_ = dVar10;
    auVar13 = vfmadd231sd_fma(auVar13,auVar20,auVar17);
    auVar11._0_8_ = (ulong)bVar2 * (long)auVar21._0_8_ + (ulong)!bVar2 * (long)HVar1;
    auVar11._8_8_ = 0;
    auVar14 = vfmadd231sd_fma(auVar14,auVar19,auVar11);
  } while (lVar5 != 3);
  *error = auVar14._0_8_;
  return auVar13._0_8_;
}

Assistant:

hacd::HaF64 Determinant3x3 (const hacd::HaF64 matrix[3][3], hacd::HaF64* const error)
{
	hacd::HaF64 sign = hacd::HaF64 (-1.0f);
	hacd::HaF64 det = hacd::HaF64 (0.0f);
	hacd::HaF64 accError = hacd::HaF64 (0.0f); 
	for (hacd::HaI32 i = 0; i < 3; i ++)  {
		hacd::HaF64 cofactor[2][2];
		for (hacd::HaI32 j = 0; j < 2; j ++) {
			hacd::HaI32 k0 = 0;
			for (hacd::HaI32 k = 0; k < 3; k ++) {
				if (k != i) {
					cofactor[j][k0] = matrix[j][k];
					k0 ++;
				}
			}
		}

		hacd::HaF64 parcialError;
		hacd::HaF64 minorDet = Determinant2x2 (cofactor, &parcialError);
		accError += parcialError * Absolute (matrix[2][i]);
		det += sign * minorDet * matrix[2][i];
		sign *= hacd::HaF64 (-1.0f);
	}

	*error = accError;
	return det;
}